

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

int duckdb_hll::hex_digit_to_int(char c)

{
  undefined4 uVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  uVar1 = (undefined4)CONCAT71(in_register_00000039,c);
  switch(uVar1) {
  case 0x31:
    iVar2 = 1;
    break;
  case 0x32:
    iVar2 = 2;
    break;
  case 0x33:
    iVar2 = 3;
    break;
  case 0x34:
    iVar2 = 4;
    break;
  case 0x35:
    iVar2 = 5;
    break;
  case 0x36:
    iVar2 = 6;
    break;
  case 0x37:
    iVar2 = 7;
    break;
  case 0x38:
    iVar2 = 8;
    break;
  case 0x39:
    iVar2 = 9;
    break;
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
switchD_00ec482b_caseD_3a:
    return 0;
  case 0x41:
switchD_00ec482b_caseD_41:
    iVar2 = 10;
    break;
  case 0x42:
switchD_00ec482b_caseD_42:
    iVar2 = 0xb;
    break;
  case 0x43:
switchD_00ec482b_caseD_43:
    iVar2 = 0xc;
    break;
  case 0x44:
switchD_00ec482b_caseD_44:
    iVar2 = 0xd;
    break;
  case 0x45:
switchD_00ec482b_caseD_45:
    iVar2 = 0xe;
    break;
  case 0x46:
switchD_00ec482b_caseD_3a:
    return 0xf;
  default:
    switch(uVar1) {
    case 0x61:
      goto switchD_00ec482b_caseD_41;
    case 0x62:
      goto switchD_00ec482b_caseD_42;
    case 99:
      goto switchD_00ec482b_caseD_43;
    case 100:
      goto switchD_00ec482b_caseD_44;
    case 0x65:
      goto switchD_00ec482b_caseD_45;
    case 0x66:
      goto switchD_00ec482b_caseD_3a;
    default:
      goto switchD_00ec482b_caseD_3a;
    }
  }
  return iVar2;
}

Assistant:

int hex_digit_to_int(char c) {
    switch(c) {
    case '0': return 0;
    case '1': return 1;
    case '2': return 2;
    case '3': return 3;
    case '4': return 4;
    case '5': return 5;
    case '6': return 6;
    case '7': return 7;
    case '8': return 8;
    case '9': return 9;
    case 'a': case 'A': return 10;
    case 'b': case 'B': return 11;
    case 'c': case 'C': return 12;
    case 'd': case 'D': return 13;
    case 'e': case 'E': return 14;
    case 'f': case 'F': return 15;
    default: return 0;
    }
}